

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::generateRandomConfig
          (IterationConfig *__return_storage_ptr__,BBoxRenderCase *this,int seed,
          IVec2 *renderTargetSize)

{
  BBoxSize BVar1;
  uint uVar2;
  deUint32 dVar3;
  IterationConfig *pIVar4;
  IterationConfig *extraout_RAX;
  IterationConfig *extraout_RAX_00;
  uint uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar6 = renderTargetSize->m_data[0];
  if (0x1ff < renderTargetSize->m_data[0]) {
    iVar6 = 0x200;
  }
  dVar3 = deRandom_getUint32(&local_40);
  uVar2 = dVar3 % (iVar6 - 0xffU);
  (__return_storage_ptr__->viewportSize).m_data[0] = uVar2 + 0x100;
  iVar6 = 0x200;
  if (renderTargetSize->m_data[1] < 0x200) {
    iVar6 = renderTargetSize->m_data[1];
  }
  dVar3 = deRandom_getUint32(&local_40);
  uVar5 = dVar3 % (iVar6 - 0xffU);
  (__return_storage_ptr__->viewportSize).m_data[1] = uVar5 + 0x100;
  iVar6 = renderTargetSize->m_data[0];
  dVar3 = deRandom_getUint32(&local_40);
  (__return_storage_ptr__->viewportPos).m_data[0] = dVar3 % ((iVar6 - uVar2) - 0xff);
  iVar6 = renderTargetSize->m_data[1];
  dVar3 = deRandom_getUint32(&local_40);
  (__return_storage_ptr__->viewportPos).m_data[1] = dVar3 % ((iVar6 - uVar5) - 0xff);
  fVar7 = deRandom_getFloat(&local_40);
  fVar8 = deRandom_getFloat(&local_40);
  fVar9 = deRandom_getFloat(&local_40);
  fVar10 = deRandom_getFloat(&local_40);
  fVar7 = fVar7 + 0.4;
  fVar8 = fVar8 + 0.4;
  fVar13 = fVar9 * ((1.0 - fVar7) + 1.0) + -1.0;
  fVar14 = fVar10 * ((1.0 - fVar8) + 1.0) + -1.0;
  (__return_storage_ptr__->patternPos).m_data[0] = fVar13;
  (__return_storage_ptr__->patternPos).m_data[1] = fVar14;
  (__return_storage_ptr__->patternSize).m_data[0] = fVar7;
  (__return_storage_ptr__->patternSize).m_data[1] = fVar8;
  (__return_storage_ptr__->bbox).min.m_data[0] = fVar13;
  (__return_storage_ptr__->bbox).min.m_data[1] = fVar14;
  (__return_storage_ptr__->bbox).min.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[3] = 1.0;
  fVar9 = fVar7 + fVar13;
  fVar10 = fVar8 + fVar14;
  (__return_storage_ptr__->bbox).max.m_data[0] = fVar9;
  (__return_storage_ptr__->bbox).max.m_data[1] = fVar10;
  (__return_storage_ptr__->bbox).max.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[3] = 1.0;
  BVar1 = this->m_bboxSize;
  pIVar4 = (IterationConfig *)(ulong)BVar1;
  if (BVar1 == BBOXSIZE_SMALLER) {
    fVar11 = deRandom_getFloat(&local_40);
    fVar12 = deRandom_getFloat(&local_40);
    *(ulong *)(__return_storage_ptr__->bbox).min.m_data =
         CONCAT44(fVar12 * 0.4 * fVar8 + fVar14,fVar11 * 0.4 * fVar7 + fVar13);
    fVar13 = deRandom_getFloat(&local_40);
    fVar14 = deRandom_getFloat(&local_40);
    *(ulong *)(__return_storage_ptr__->bbox).max.m_data =
         CONCAT44(fVar14 * -0.4 * fVar8 + fVar10,fVar13 * -0.4 * fVar7 + fVar9);
    pIVar4 = extraout_RAX_00;
  }
  else if (BVar1 == BBOXSIZE_LARGER) {
    fVar7 = deRandom_getFloat(&local_40);
    fVar8 = deRandom_getFloat(&local_40);
    *(ulong *)(__return_storage_ptr__->bbox).min.m_data =
         CONCAT44(fVar14 - fVar8 * 0.5,fVar13 - fVar7 * 0.5);
    fVar7 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[2] = 0.0 - fVar7 * 0.5;
    fVar7 = deRandom_getFloat(&local_40);
    fVar8 = deRandom_getFloat(&local_40);
    *(ulong *)(__return_storage_ptr__->bbox).max.m_data =
         CONCAT44(fVar8 * 0.5 + fVar10,fVar7 * 0.5 + fVar9);
    fVar7 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[2] = fVar7 * 0.5 + 0.0;
    pIVar4 = extraout_RAX;
  }
  return pIVar4;
}

Assistant:

BBoxRenderCase::IterationConfig BBoxRenderCase::generateRandomConfig (int seed, const tcu::IVec2& renderTargetSize) const
{
	de::Random		rnd		(seed);
	IterationConfig	config;

	// viewport config
	config.viewportSize.x()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.x(), MAX_VIEWPORT_SIZE));
	config.viewportSize.y()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.y(), MAX_VIEWPORT_SIZE));
	config.viewportPos.x()	= rnd.getInt(0, renderTargetSize.x() - config.viewportSize.x());
	config.viewportPos.y()	= rnd.getInt(0, renderTargetSize.y() - config.viewportSize.y());

	// pattern location inside viewport
	config.patternSize.x()	= rnd.getFloat(0.4f, 1.4f);
	config.patternSize.y()	= rnd.getFloat(0.4f, 1.4f);
	config.patternPos.x()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.x());
	config.patternPos.y()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.y());

	// accurate bounding box
	config.bbox.min			= tcu::Vec4(config.patternPos.x(), config.patternPos.y(), 0.0f, 1.0f);
	config.bbox.max			= tcu::Vec4(config.patternPos.x() + config.patternSize.x(), config.patternPos.y() + config.patternSize.y(), 0.0f, 1.0f);

	if (m_bboxSize == BBOXSIZE_LARGER)
	{
		// increase bbox size
		config.bbox.min.x() -= rnd.getFloat() * 0.5f;
		config.bbox.min.y() -= rnd.getFloat() * 0.5f;
		config.bbox.min.z() -= rnd.getFloat() * 0.5f;

		config.bbox.max.x() += rnd.getFloat() * 0.5f;
		config.bbox.max.y() += rnd.getFloat() * 0.5f;
		config.bbox.max.z() += rnd.getFloat() * 0.5f;
	}
	else if (m_bboxSize == BBOXSIZE_SMALLER)
	{
		// reduce bbox size
		config.bbox.min.x() += rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.min.y() += rnd.getFloat() * 0.4f * config.patternSize.y();

		config.bbox.max.x() -= rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.max.y() -= rnd.getFloat() * 0.4f * config.patternSize.y();
	}

	return config;
}